

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan,false,false,true,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  long lVar6;
  idx_t iVar7;
  sel_t sVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  ulong uVar16;
  ulong uVar17;
  
  if (count + 0x3f < 0x40) {
    iVar7 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar7 = 0;
    lVar10 = 0;
    uVar14 = 0;
    uVar16 = 0;
    do {
      uVar11 = uVar14;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar17 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar17 = count;
        }
LAB_01484e9a:
        if (uVar14 < uVar17) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          uVar13 = uVar14 << 4 | 8;
          do {
            uVar11 = uVar14;
            if (psVar2 != (sel_t *)0x0) {
              uVar11 = (ulong)psVar2[uVar14];
            }
            uVar9 = *(ulong *)((long)ldata + (uVar13 - 8));
            lVar5 = *(long *)((long)&ldata->lower + uVar13);
            lVar6 = *(long *)((long)&rdata->lower + uVar13);
            bVar15 = lVar5 == lVar6;
            uVar12 = *(ulong *)((long)rdata + (uVar13 - 8));
            psVar3[iVar7] = (sel_t)uVar11;
            iVar7 = iVar7 + (uVar12 < uVar9 && bVar15 || !bVar15 && lVar6 <= lVar5);
            psVar4[lVar10] = (sel_t)uVar11;
            lVar10 = lVar10 + (ulong)((uVar9 <= uVar12 || !bVar15) && (bVar15 || lVar6 > lVar5));
            uVar14 = uVar14 + 1;
            uVar13 = uVar13 + 0x10;
            uVar11 = uVar17;
          } while (uVar17 != uVar14);
        }
      }
      else {
        uVar13 = puVar1[uVar16];
        uVar17 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar17 = count;
        }
        if (uVar13 == 0xffffffffffffffff) goto LAB_01484e9a;
        if (uVar13 == 0) {
          uVar11 = uVar17;
          if (uVar14 < uVar17) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            do {
              uVar11 = uVar14;
              if (psVar2 != (sel_t *)0x0) {
                uVar11 = (ulong)psVar2[uVar14];
              }
              psVar3[lVar10] = (sel_t)uVar11;
              lVar10 = lVar10 + 1;
              uVar14 = uVar14 + 1;
              uVar11 = uVar17;
            } while (uVar17 != uVar14);
          }
        }
        else if (uVar14 < uVar17) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          uVar9 = uVar14 << 4 | 8;
          uVar12 = 0;
          do {
            if (psVar2 == (sel_t *)0x0) {
              sVar8 = (int)uVar14 + (int)uVar12;
            }
            else {
              sVar8 = psVar2[uVar14 + uVar12];
            }
            if ((uVar13 >> (uVar12 & 0x3f) & 1) == 0) {
              bVar15 = false;
            }
            else {
              lVar5 = *(long *)((long)&ldata->lower + uVar9);
              lVar6 = *(long *)((long)&rdata->lower + uVar9);
              bVar15 = *(ulong *)((long)rdata + (uVar9 - 8)) < *(ulong *)((long)ldata + (uVar9 - 8))
                       && lVar5 == lVar6 || lVar5 != lVar6 && lVar6 <= lVar5;
            }
            psVar3[iVar7] = sVar8;
            iVar7 = iVar7 + bVar15;
            psVar4[lVar10] = sVar8;
            lVar10 = lVar10 + (ulong)(bVar15 ^ 1);
            uVar12 = uVar12 + 1;
            uVar9 = uVar9 + 0x10;
            uVar11 = uVar17;
          } while (uVar17 - uVar14 != uVar12);
        }
      }
      uVar14 = uVar11;
      uVar16 = uVar16 + 1;
    } while (uVar16 != count + 0x3f >> 6);
  }
  return iVar7;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}